

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall
VectorsTest_Int3ProductScalarAssignment_Test::TestBody
          (VectorsTest_Int3ProductScalarAssignment_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Int3 v1;
  AssertHelper *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  int *expected;
  char *in_stack_fffffffffffffee0;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int line;
  char *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  Type TVar2;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult *this_02;
  Vector3<int> *this_03;
  AssertionResult *this_04;
  Vector3<int> local_ac;
  AssertionResult local_a0 [2];
  Vector3<int> local_7c;
  AssertionResult local_70;
  uint local_5c;
  Vector3<int> local_34;
  AssertionResult local_28;
  Vector3<int> local_14;
  
  TVar2 = (Type)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  pica::Vector3<int>::Vector3(&local_14,3,5,-2);
  pica::operator*=(&local_14,5);
  this_03 = &local_34;
  pica::Vector3<int>::Vector3(this_03,0xf,0x19,-10);
  this_04 = &local_28;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_04);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff00);
    testing::AssertionResult::failure_message((AssertionResult *)0x1d9aa1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff00,TVar2,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_04,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x1d9afe);
  }
  local_5c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9b6c);
  if (local_5c == 0) {
    TVar2 = (Type)((ulong)&local_14.y >> 0x20);
    pica::Vector3<int>::Vector3(&local_7c,0xf,0x19,-10);
    this_02 = &local_70;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      in_stack_fffffffffffffef0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1d9c3a);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_02,TVar2,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                 in_stack_fffffffffffffee0);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_04,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffed0);
      testing::Message::~Message((Message *)0x1d9c97);
    }
    local_5c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9d05);
    if (local_5c == 0) {
      expected = &local_14.z;
      pica::Vector3<int>::Vector3(&local_ac,0xf,0x19,-10);
      this_01 = local_a0;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 &this_01->success_,expected,(int *)in_stack_fffffffffffffed0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
      line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
      if (!bVar1) {
        testing::Message::Message((Message *)this_02);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x1d9dd3);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_02,TVar2,in_stack_fffffffffffffef0,line,&this_01->success_);
        testing::internal::AssertHelper::operator=((AssertHelper *)this_04,(Message *)this_03);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x1d9e27);
      }
      local_5c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9e8f);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, Int3ProductScalarAssignment)
{
    Int3 v1(3, 5, -2);
    v1 *= 5;
    ASSERT_EQ_INT3(v1, Int3(15, 25, -10));
}